

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_ori_8_pi7(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar4 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  uVar1 = m68k_read_memory_16(uVar4 & m68ki_cpu.address_mask);
  uVar4 = m68ki_cpu.dar[0xf];
  m68ki_cpu.dar[0xf] = m68ki_cpu.dar[0xf] + 2;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar2 = uVar4;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(uVar4);
  }
  uVar3 = m68k_read_memory_8(uVar2 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  uVar1 = (uVar3 | uVar1) & 0xff;
  m68k_write_memory_8(uVar4 & m68ki_cpu.address_mask,uVar1);
  m68ki_cpu.n_flag = uVar1;
  m68ki_cpu.not_z_flag = uVar1;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_ori_8_pi7(void)
{
	uint src = OPER_I_8();
	uint ea = EA_A7_PI_8();
	uint res = MASK_OUT_ABOVE_8(src | m68ki_read_8(ea));

	m68ki_write_8(ea, res);

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
}